

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

int __thiscall CVmPackPos::parse_int(CVmPackPos *this)

{
  wchar_t wVar1;
  uint uVar2;
  int iVar3;
  
  wVar1 = getch(this);
  uVar2 = wVar1 + L'\xffffffd0';
  iVar3 = 0;
  if (uVar2 < 10) {
    iVar3 = 0;
    do {
      iVar3 = uVar2 + iVar3 * 10;
      inc(this);
      wVar1 = getch(this);
      uVar2 = wVar1 + L'\xffffffd0';
    } while (uVar2 < 10);
  }
  return iVar3;
}

Assistant:

int parse_int()
    {
        /* remember the starting location, for error reporting */
        int start_idx = idx;

        /* parse digits until we find something else */
        int acc;
        wchar_t c;
        for (acc = 0 ; is_digit(c = getch()) ; inc())
        {
            /* add the digit into the accumulator */
            acc *= 10;
            acc += value_of_digit(c);

            /* if this overflows an int, it's an error */
            if (acc < 0)
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, start_idx);
        }

        /* return the result */
        return acc;
    }